

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O0

void __thiscall NaNNUnit::PrintLog(NaNNUnit *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  NaNNUnit *in_RDI;
  char *fmt;
  NaReal NVar4;
  uint iInput;
  uint iNeuron;
  uint iLayer;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint local_14;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar5;
  undefined4 in_stack_fffffffffffffff4;
  
  NaPrintLog("NaNNUnit(this=%p):\n  includes ");
  NaNeuralNetDescr::PrintLog
            ((NaNeuralNetDescr *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  NaUnit::PrintLog(&in_RDI->super_NaUnit);
  NaPrintLog("  network has the next tunable parameters:\n");
  uVar1 = InputLayer(in_RDI);
  while( true ) {
    uVar5 = uVar1;
    uVar2 = OutputLayer((NaNNUnit *)0x1476f7);
    if (uVar2 < uVar1) break;
    uVar1 = uVar5;
    uVar2 = (**(code **)(*(long *)(&in_RDI->field_0xf8 + (ulong)uVar5 * 0x18) + 0x38))();
    uVar3 = (**(code **)(*(long *)(&in_RDI->field_0xf8 + (ulong)uVar1 * 0x18) + 0x30))();
    NaPrintLog("  * layer #%u (%u inputs, %u neurons)\n",(ulong)uVar5,(ulong)uVar2,(ulong)uVar3);
    uVar5 = 0;
    while( true ) {
      uVar2 = uVar5;
      uVar3 = (**(code **)(*(long *)(&in_RDI->field_0xf8 + (ulong)uVar1 * 0x18) + 0x30))();
      if (uVar3 <= uVar5) break;
      uVar5 = uVar2;
      (**(code **)(*(long *)(&in_RDI->field_0x200 + (ulong)uVar1 * 0x18) + 0x50))
                (&in_RDI->field_0x200 + (ulong)uVar1 * 0x18,uVar2);
      NaPrintLog("    * neuron #%u (bias / weights)\n      %+7.3f /",(ulong)uVar2);
      local_14 = 0;
      while( true ) {
        uVar2 = (**(code **)(*(long *)(&in_RDI->field_0xf8 + (ulong)uVar1 * 0x18) + 0x38))();
        if (uVar2 <= local_14) break;
        (**(code **)(*(long *)(&in_RDI->field_0xf8 + (ulong)uVar1 * 0x18) + 0x58))
                  (&in_RDI->field_0xf8 + (ulong)uVar1 * 0x18,uVar5,local_14);
        NaPrintLog("\t%+6.3f");
        local_14 = local_14 + 1;
      }
      NaPrintLog("\n");
      uVar5 = uVar5 + 1;
    }
    uVar1 = uVar1 + 1;
  }
  NaPrintLog("  defined scale for output layer:\n");
  uVar1 = 0;
  while( true ) {
    uVar5 = uVar1;
    uVar2 = (*(in_RDI->super_NaUnit).super_NaLogging._vptr_NaLogging[10])();
    if (uVar2 <= uVar1) break;
    uVar1 = uVar5;
    fmt = (char *)NaVector::operator()
                            ((NaVector *)CONCAT44(uVar5,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffac);
    NVar4 = NaVector::operator()
                      ((NaVector *)CONCAT44(uVar5,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
    NaPrintLog(fmt,SUB84(NVar4,0),"    * neuron #%u\tmin=%g\tmax=%g\n",(ulong)uVar5);
    uVar1 = uVar1 + 1;
  }
  return;
}

Assistant:

void
NaNNUnit::PrintLog () const
{
    unsigned    iLayer, iNeuron, iInput;

    NaPrintLog("NaNNUnit(this=%p):\n  includes ", this);
    descr.PrintLog();
    NaUnit::PrintLog();
    NaPrintLog("  network has the next tunable parameters:\n");

    for(iLayer = InputLayer(); iLayer <= OutputLayer(); ++iLayer){
        NaPrintLog("  * layer #%u (%u inputs, %u neurons)\n", iLayer,
                   weight[iLayer].dim_cols(),
                   weight[iLayer].dim_rows());
        for(iNeuron = 0; iNeuron < weight[iLayer].dim_rows(); ++iNeuron){
            NaPrintLog("    * neuron #%u (bias / weights)\n      %+7.3f /",
                       iNeuron, bias[iLayer](iNeuron));
            for(iInput = 0; iInput < weight[iLayer].dim_cols(); ++iInput){
                NaPrintLog("\t%+6.3f", weight[iLayer](iNeuron, iInput));
            }// for inputs of neuron
            NaPrintLog("\n");
        }// for neurons of layer
    }// for layers

    NaPrintLog("  defined scale for output layer:\n");

    for(iNeuron = 0; iNeuron < (unsigned)OutputDim(); ++iNeuron){
        NaPrintLog("    * neuron #%u\tmin=%g\tmax=%g\n", iNeuron,
                   OutputScaler.min(iNeuron), OutputScaler.max(iNeuron));
    }
}